

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Segment::DoneParsing(Segment *this)

{
  int iVar1;
  longlong total;
  longlong avail;
  long local_18;
  undefined1 local_10 [8];
  
  if (this->m_size < 0) {
    iVar1 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_18,local_10);
    if (iVar1 < 0) {
      return true;
    }
    if (local_18 < 0) {
      return false;
    }
  }
  else {
    local_18 = this->m_size + this->m_start;
  }
  return local_18 <= this->m_pos;
}

Assistant:

bool Segment::DoneParsing() const {
  if (m_size < 0) {
    long long total, avail;

    const int status = m_pReader->Length(&total, &avail);

    if (status < 0)  // error
      return true;  // must assume done

    if (total < 0)
      return false;  // assume live stream

    return (m_pos >= total);
  }

  const long long stop = m_start + m_size;

  return (m_pos >= stop);
}